

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

void prvTidyFixLanguageInformation(TidyDocImpl *doc,Node *node,Bool wantXmlLang,Bool wantLang)

{
  Node *node_00;
  Bool BVar1;
  uint uVar2;
  Stack *stack;
  AttVal *attr;
  AttVal *attr_00;
  AttVal *pAVar3;
  char *name;
  Lexer *pLVar4;
  
  stack = prvTidynewStack(doc,0x10);
  if (node != (Node *)0x0) {
    do {
      node_00 = node->next;
      BVar1 = prvTidynodeIsElement(node);
      if (BVar1 != no) {
        attr = prvTidyAttrGetById(node,TidyAttr_LANG);
        attr_00 = prvTidyAttrGetById(node,TidyAttr_XML_LANG);
        if (attr == (AttVal *)0x0 || attr_00 == (AttVal *)0x0) {
          if ((wantXmlLang == no) || (attr == (AttVal *)0x0)) {
            if ((wantLang == no) || (attr_00 == (AttVal *)0x0)) goto LAB_0014c502;
            uVar2 = prvTidyNodeAttributeVersions(node,TidyAttr_LANG);
            pLVar4 = doc->lexer;
            name = "lang";
            pAVar3 = attr_00;
          }
          else {
            uVar2 = prvTidyNodeAttributeVersions(node,TidyAttr_XML_LANG);
            pLVar4 = doc->lexer;
            name = "xml:lang";
            pAVar3 = attr;
          }
          if ((pLVar4->versionEmitted & uVar2) != 0) {
            prvTidyRepairAttrValue(doc,node,name,pAVar3->value);
          }
        }
LAB_0014c502:
        if ((wantLang == no) && (attr != (AttVal *)0x0)) {
          prvTidyRemoveAttribute(doc,node,attr);
        }
        if ((wantXmlLang == no) && (attr_00 != (AttVal *)0x0)) {
          prvTidyRemoveAttribute(doc,node,attr_00);
        }
      }
      if (node->content == (Node *)0x0) {
        node = node_00;
        if (node_00 == (Node *)0x0) {
          node = prvTidypop(stack);
        }
      }
      else {
        prvTidypush(stack,node_00);
        node = node->content;
      }
    } while (node != (Node *)0x0);
  }
  prvTidyfreeStack(stack);
  return;
}

Assistant:

void TY_(FixLanguageInformation)(TidyDocImpl* doc, Node* node, Bool wantXmlLang, Bool wantLang)
{
    Stack *stack = TY_(newStack)(doc, 16);
    Node* next;

    while (node)
    {
        next = node->next;

        /* todo: report modifications made here to the report system */

        if (TY_(nodeIsElement)(node))
        {
            AttVal* lang = TY_(AttrGetById)(node, TidyAttr_LANG);
            AttVal* xmlLang = TY_(AttrGetById)(node, TidyAttr_XML_LANG);

            if (lang && xmlLang)
            {
                /*
                  todo: check whether both attributes are in sync,
                  here or elsewhere, where elsewhere is probably
                  preferable.
                  AD - March 2005: not mandatory according the standards.
                */
            }
            else if (lang && wantXmlLang)
            {
                if (TY_(NodeAttributeVersions)( node, TidyAttr_XML_LANG )
                    & doc->lexer->versionEmitted)
                    TY_(RepairAttrValue)(doc, node, "xml:lang", lang->value);
            }
            else if (xmlLang && wantLang)
            {
                if (TY_(NodeAttributeVersions)( node, TidyAttr_LANG )
                    & doc->lexer->versionEmitted)
                    TY_(RepairAttrValue)(doc, node, "lang", xmlLang->value);
            }

            if (lang && !wantLang)
                TY_(RemoveAttribute)(doc, node, lang);
            
            if (xmlLang && !wantXmlLang)
                TY_(RemoveAttribute)(doc, node, xmlLang);
        }

        if (node->content)
        {
            TY_(push)(stack, next);
            node = node->content;
            continue;
        }

        node = next ? next : TY_(pop)(stack);
    }
    TY_(freeStack)(stack);
}